

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_move_32_di_d(void)

{
  uint value;
  uint uVar1;
  uint uVar2;
  uint ea;
  uint res;
  
  value = m68ki_cpu.dar[m68ki_cpu.ir & 7];
  uVar1 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir >> 9 & 7) + 8];
  uVar2 = m68ki_read_imm_16();
  m68ki_write_32_fc(uVar1 + (int)(short)uVar2,m68ki_cpu.s_flag | 1,value);
  m68ki_cpu.n_flag = value >> 0x18;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_32_di_d(void)
{
	uint res = DY;
	uint ea = EA_AX_DI_32();

	m68ki_write_32(ea, res);

	FLAG_N = NFLAG_32(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}